

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O2

FName __thiscall
CommandDrawSwitchableImage::LookupKeySpecies(CommandDrawSwitchableImage *this,int keynum)

{
  PClassActor *ti;
  bool bVar1;
  int iVar2;
  uint i;
  ulong uVar3;
  
  uVar3 = 0;
  do {
    if (PClassActor::AllActorClasses.Count <= uVar3) {
      iVar2 = 0;
LAB_0057144b:
      *(int *)&(this->super_CommandDrawImage).super_SBarInfoCommandFlowControl.super_SBarInfoCommand
               ._vptr_SBarInfoCommand = iVar2;
      return (FName)(int)this;
    }
    ti = PClassActor::AllActorClasses.Array[uVar3];
    bVar1 = PClass::IsAncestorOf(AKey::RegistrationInfo.MyClass,&ti->super_PClass);
    if ((bVar1) && ((uint)(ti->super_PClass).Defaults[0x4dc] == keynum)) {
      iVar2 = (ti->super_PClass).super_PStruct.super_PNamedType.TypeName.Index;
      goto LAB_0057144b;
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

static FName LookupKeySpecies(int keynum)
		{
			for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
			{
				PClassActor *cls = PClassActor::AllActorClasses[i];
				if (cls->IsDescendantOf(RUNTIME_CLASS(AKey)))
				{
					AKey *key = (AKey *)GetDefaultByType(cls);
					if (key->KeyNumber == keynum)
						return cls->TypeName;
				}
			}
			return NAME_None;
		}